

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O0

void __thiscall
ChunkedSequenceChunkIterators_TwoChunks_Test::TestBody
          (ChunkedSequenceChunkIterators_TwoChunks_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer pcVar3;
  AssertHelper local_110;
  Message local_108;
  _List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  uint local_d4;
  size_t local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  uint local_a4;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  iterator it;
  Message local_78;
  uint local_6c;
  size_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  int local_48;
  int local_34;
  undefined1 local_30 [8];
  chunked_sequence<int,_2UL,_4UL,_4UL> cs;
  ChunkedSequenceChunkIterators_TwoChunks_Test *this_local;
  
  cs.size_ = (size_type)this;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunked_sequence
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_34 = 0x2f;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,&local_34);
  local_48 = 0x35;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,&stack0xffffffffffffffb8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x3b;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_68 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_6c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_60,"cs.chunks_size ()","2U",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x19d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_begin
                   ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  pcVar3 = std::_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>::operator->
                     ((_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> *)
                      &gtest_ar_1.message_);
  local_a0 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::size(pcVar3);
  local_a4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_98,"it->size ()","2U",&local_a0,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x19f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::advance<std::_List_iterator<pstore::chunked_sequence<int,2ul,4ul,4ul>::chunk>,int>
            ((_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> *)
             &gtest_ar_1.message_,1);
  pcVar3 = std::_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>::operator->
                     ((_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> *)
                      &gtest_ar_1.message_);
  local_d0 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::size(pcVar3);
  local_d4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_c8,"it->size ()","1U",&local_d0,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x1a1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::advance<std::_List_iterator<pstore::chunked_sequence<int,2ul,4ul,4ul>::chunk>,int>
            ((_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> *)
             &gtest_ar_1.message_,1);
  local_100._M_node =
       (_List_node_base *)
       pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_end
                 ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  testing::internal::EqHelper::
  Compare<std::_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>,_std::_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>,_nullptr>
            ((EqHelper *)local_f8,"it","cs.chunks_end ()",
             (_List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> *)
             &gtest_ar_1.message_,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x1a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::~chunked_sequence
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  return;
}

Assistant:

TEST (ChunkedSequenceChunkIterators, TwoChunks) {
    pstore::chunked_sequence<int, 2U> cs;

    cs.emplace_back (47);
    cs.emplace_back (53);
    cs.emplace_back (59);

    EXPECT_EQ (cs.chunks_size (), 2U);
    decltype (cs)::chunk_list::iterator it = cs.chunks_begin ();
    EXPECT_EQ (it->size (), 2U);
    std::advance (it, 1);
    EXPECT_EQ (it->size (), 1U);
    std::advance (it, 1);
    EXPECT_EQ (it, cs.chunks_end ());
}